

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *p,Vec_Int_t *vEquivs,Vec_Str_t *vStatus)

{
  ulong uVar1;
  char cVar2;
  uint uVar3;
  int v;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint local_3c;
  
  if (vStatus->nSize * 2 != vEquivs->nSize) {
    __assert_fail("Vec_StrSize(vStatus) * 2 == Vec_IntSize(vEquivs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                  ,0x34b,"int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)"
                 );
  }
  iVar7 = 0;
  while (iVar7 < p->nObjs) {
    pGVar4 = Gia_ManObj(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar7 = iVar7 + 1;
    if (((undefined1  [12])*pGVar4 & (undefined1  [12])0x4000000000000000) != (undefined1  [12])0x0)
    {
      __assert_fail("pObj->fMark1 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                    ,0x34f,
                    "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)");
    }
  }
  iVar7 = 1;
  local_3c = 0;
  for (iVar8 = 0; iVar8 < vStatus->nSize; iVar8 = iVar8 + 1) {
    uVar3 = Vec_IntEntry(vEquivs,iVar7 + -1);
    v = Vec_IntEntry(vEquivs,iVar7);
    if (uVar3 != ((uint)p->pReprs[v] & 0xfffffff)) {
      __assert_fail("iRepr == Gia_ObjRepr(p, iObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                    ,0x358,
                    "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)");
    }
    cVar2 = Vec_StrEntry(vStatus,iVar8);
    if (cVar2 != '\x01') {
      pGVar4 = Gia_ManObj(p,v);
      *(ulong *)pGVar4 = *(ulong *)pGVar4 | 0x4000000000000000;
      local_3c = local_3c + 1;
    }
    iVar7 = iVar7 + 2;
  }
  for (uVar3 = 0; uVar3 != 100; uVar3 = uVar3 + 1) {
    for (iVar7 = 1; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManObj(p,iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar1 = *(ulong *)pGVar4;
      uVar10 = (uint)uVar1;
      if ((~uVar10 & 0x9fffffff) != 0) {
        uVar6 = uVar1 & 0x1fffffff;
        if ((int)uVar10 < 0 || uVar6 == 0x1fffffff) {
          if ((-1 < (int)uVar10) || ((int)uVar6 == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecCorr.c"
                          ,0x366,
                          "int Cec_ManLSCorrAnalyzeDependence(Gia_Man_t *, Vec_Int_t *, Vec_Str_t *)"
                         );
          }
          uVar6 = *(ulong *)(pGVar4 + -uVar6);
        }
        else {
          uVar6 = *(ulong *)(pGVar4 + -(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)) |
                  *(ulong *)(pGVar4 + -uVar6);
        }
        *(ulong *)pGVar4 = uVar6 & 0x4000000000000000 | uVar1;
      }
    }
    iVar8 = 0;
    for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
      pGVar4 = Gia_ManCo(p,(p->vCos->nSize - p->nRegs) + iVar7);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar5 = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + iVar7);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar1 = *(ulong *)pGVar5;
      uVar6 = *(ulong *)pGVar4;
      *(ulong *)pGVar5 = uVar1 & 0xbfffffffffffffff | uVar6 & 0x4000000000000000;
      iVar8 = iVar8 + (uint)(((uVar6 ^ uVar1) >> 0x3e & 1) != 0);
    }
    if (iVar8 == 0) break;
  }
  uVar10 = 0;
  for (lVar9 = 0; lVar9 < p->nObjs; lVar9 = lVar9 + 1) {
    pGVar4 = Gia_ManObj(p,(int)lVar9);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((*(ulong *)pGVar4 & 0x4000000000000000) != 0) {
      uVar10 = (uVar10 + 1) - (uint)((~(uint)p->pReprs[lVar9] & 0xfffffff) == 0);
    }
    *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffffffffff;
  }
  printf("%5d -> %5d (%3d)  ",(ulong)local_3c,(ulong)uVar10,(ulong)uVar3);
  return 0;
}

Assistant:

int Cec_ManLSCorrAnalyzeDependence( Gia_Man_t * p, Vec_Int_t * vEquivs, Vec_Str_t * vStatus )
{
    Gia_Obj_t * pObj, * pObjRo;
    int i, Iter, iObj, iRepr, fPrev, Total, Count0, Count1;
    assert( Vec_StrSize(vStatus) * 2 == Vec_IntSize(vEquivs) );
    Total = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        assert( pObj->fMark1 == 0 );
        if ( Gia_ObjHasRepr(p, i) )
            Total++;
    }
    Count0 = 0;
    for ( i = 0; i < Vec_StrSize(vStatus); i++ )
    {
        iRepr = Vec_IntEntry(vEquivs, 2*i);
        iObj = Vec_IntEntry(vEquivs, 2*i+1);
        assert( iRepr == Gia_ObjRepr(p, iObj) );
        if ( Vec_StrEntry(vStatus, i) != 1 ) // disproved or undecided
        {
            Gia_ManObj(p, iObj)->fMark1 = 1;
            Count0++;
        }
    }
    for ( Iter = 0; Iter < 100; Iter++ )
    {
        int fChanges = 0;
        Gia_ManForEachObj1( p, pObj, i )
        {
            if ( Gia_ObjIsCi(pObj) )
                continue;
            assert( Gia_ObjIsAnd(pObj) || Gia_ObjIsCo(pObj) );
//            fPrev = pObj->fMark1;
            if ( Gia_ObjIsAnd(pObj) )
                pObj->fMark1 |= Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else
                pObj->fMark1 |= Gia_ObjFanin0(pObj)->fMark1;
//            fChanges += fPrev ^ pObj->fMark1;
        }
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
        {
            fPrev = pObjRo->fMark1;
            pObjRo->fMark1 = pObj->fMark1;
            fChanges += fPrev ^ pObjRo->fMark1;
        }
        if ( fChanges == 0 )
            break;
    }
    Count1 = 0;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( pObj->fMark1 && Gia_ObjHasRepr(p, i) )
            Count1++;
        pObj->fMark1 = 0;
    }
    printf( "%5d -> %5d (%3d)  ", Count0, Count1, Iter );
    return 0;
}